

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

void __thiscall mkvmuxer::Tracks::~Tracks(Tracks *this)

{
  ulong uVar1;
  
  if (this->track_entries_ != (Track **)0x0) {
    if (this->track_entries_size_ != 0) {
      uVar1 = 0;
      do {
        if (this->track_entries_[uVar1] != (Track *)0x0) {
          (*this->track_entries_[uVar1]->_vptr_Track[1])();
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 < this->track_entries_size_);
    }
    if (this->track_entries_ != (Track **)0x0) {
      operator_delete__(this->track_entries_);
      return;
    }
  }
  return;
}

Assistant:

Tracks::~Tracks() {
  if (track_entries_) {
    for (uint32_t i = 0; i < track_entries_size_; ++i) {
      Track* const track = track_entries_[i];
      delete track;
    }
    delete[] track_entries_;
  }
}